

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void Curl_http2_cleanup_dependencies(Curl_easy *data)

{
  Curl_http2_dep *pCVar1;
  Curl_easy *pCVar2;
  Curl_easy *parent;
  
  while (pCVar1 = (data->set).stream_dependents, pCVar1 != (Curl_http2_dep *)0x0) {
    pCVar2 = pCVar1->data;
    Curl_http2_remove_child(data,pCVar2);
    parent = (data->set).stream_depends_on;
    if (parent != (Curl_easy *)0x0) {
      Curl_http2_add_child(parent,pCVar2,false);
    }
  }
  pCVar2 = (data->set).stream_depends_on;
  if (pCVar2 != (Curl_easy *)0x0) {
    Curl_http2_remove_child(pCVar2,data);
    return;
  }
  return;
}

Assistant:

void Curl_http2_cleanup_dependencies(struct Curl_easy *data)
{
  while(data->set.stream_dependents) {
    struct Curl_easy *tmp = data->set.stream_dependents->data;
    Curl_http2_remove_child(data, tmp);
    if(data->set.stream_depends_on)
      Curl_http2_add_child(data->set.stream_depends_on, tmp, FALSE);
  }

  if(data->set.stream_depends_on)
    Curl_http2_remove_child(data->set.stream_depends_on, data);
}